

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_int,unsigned_short,12>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint *lhs,unsigned_short *rhs,unsigned_short *result)

{
  ushort *in_RSI;
  uint *in_RDI;
  uint tmp;
  unsigned_short *in_stack_ffffffffffffffd8;
  
  if ((uint)*in_RSI <= *in_RDI) {
    SafeCastHelper<unsigned_short,unsigned_int,2>::
    CastThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (*in_RDI - (uint)*in_RSI,in_stack_ffffffffffffffd8);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }